

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjLevelId(Gia_Man_t *p,int Id)

{
  int iVar1;
  int Id_local;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntGetEntry(p->vLevels,Id);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjLevelId( Gia_Man_t * p, int Id )             { return Vec_IntGetEntry(p->vLevels, Id);                    }